

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O1

void __thiscall dg::llvmdg::InterproceduralDOD::_compute(InterproceduralDOD *this)

{
  CDGraph *this_00;
  CDAlgorithm CVar1;
  Module *M;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  result;
  DODRanganath dod;
  undefined1 local_c0 [56];
  undefined1 local_88 [16];
  _Link_type local_78;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  if (this->_computed != false) {
    return;
  }
  M = (this->super_LLVMControlDependenceAnalysisImpl)._module;
  if ((this->super_LLVMControlDependenceAnalysisImpl)._options.
      super_ControlDependenceAnalysisOptions.field_0x3d == '\x01') {
    ICDGraphBuilder::buildInstructions((CDGraph *)local_c0,&this->igraphBuilder,M);
  }
  else {
    ICDGraphBuilder::buildBlocks((CDGraph *)local_c0,&this->igraphBuilder,M);
  }
  this_00 = &this->graph;
  CDGraph::operator=(this_00,(CDGraph *)local_c0);
  std::
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  ::_M_erase((_Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
              *)local_88,local_78);
  std::
  vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
  ::~vector((vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
             *)(local_c0 + 0x20));
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  CVar1 = (this->super_LLVMControlDependenceAnalysisImpl)._options.
          super_ControlDependenceAnalysisOptions.algorithm;
  if (CVar1 == DODNTSCD) {
    DODNTSCD::compute((pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
                       *)local_c0,(DODNTSCD *)&local_58,this_00);
  }
  else {
    if (CVar1 != DOD) {
      if (CVar1 != DOD_RANGANATH) {
        abort();
      }
      local_58._M_buckets = &local_58._M_single_bucket;
      local_58._M_bucket_count = 1;
      local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_58._M_element_count = 0;
      local_58._M_rehash_policy._M_max_load_factor = 1.0;
      local_58._M_rehash_policy._M_next_resize = 0;
      local_58._M_single_bucket = (__node_base_ptr)0x0;
      DODRanganath::compute
                ((pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
                  *)local_c0,(DODRanganath *)&local_58,this_00);
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator=(&this->controlDependence,
                  (map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                   *)local_c0);
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator=(&this->revControlDependence,
                  (map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                   *)(local_c0 + 0x30));
      std::
      _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::_M_erase((_Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)(local_c0 + 0x30),(_Link_type)local_88._8_8_);
      std::
      _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::_M_erase((_Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)local_c0,(_Link_type)local_c0._16_8_);
      std::
      _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_58);
      goto LAB_00137b6a;
    }
    dg::DOD::compute((pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
                      *)local_c0,(DOD *)&local_58,this_00);
  }
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::operator=(&this->controlDependence,
              (map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
               *)local_c0);
  std::
  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::operator=(&this->revControlDependence,
              (map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
               *)(local_c0 + 0x30));
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_M_erase((_Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
              *)(local_c0 + 0x30),(_Link_type)local_88._8_8_);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_M_erase((_Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
              *)local_c0,(_Link_type)local_c0._16_8_);
LAB_00137b6a:
  this->_computed = true;
  return;
}

Assistant:

void _compute() {
        if (_computed)
            return;

        DBG(cda, "Triggering computation of interprocedural NTSCD");

        graph = igraphBuilder.build(getModule(),
                                    getOptions().nodePerInstruction());

        if (getOptions().dodRanganathCD()) {
            dg::DODRanganath dod;
            auto result = dod.compute(graph);
            controlDependence = std::move(result.first);
            revControlDependence = std::move(result.second);
        } else if (getOptions().dodCD()) {
            dg::DOD dod;
            auto result = dod.compute(graph);
            controlDependence = std::move(result.first);
            revControlDependence = std::move(result.second);
        } else if (getOptions().dodntscdCD()) {
            dg::DODNTSCD dodntscd;
            auto result = dodntscd.compute(graph);
            controlDependence = std::move(result.first);
            revControlDependence = std::move(result.second);
        } else {
            assert(false && "Wrong analysis type");
            abort();
        }

        _computed = true;
    }